

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
ear::Layout::isLfe(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Layout *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::vector<bool,_std::allocator<bool>_>_> bVar3;
  Layout *this_local;
  vector<bool,_std::allocator<bool>_> *isLfeMapping;
  
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__);
  cVar1 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
  cVar2 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  bVar3 = std::back_inserter<std::vector<bool,std::allocator<bool>>>(__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<ear::Channel_const*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,std::back_insert_iterator<std::vector<bool,std::allocator<bool>>>,ear::Layout::isLfe()const::__0>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> Layout::isLfe() const {
    std::vector<bool> isLfeMapping;
    std::transform(_channels.begin(), _channels.end(),
                   std::back_inserter(isLfeMapping),
                   [](Channel c) -> bool { return c.isLfe(); });
    return isLfeMapping;
  }